

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_tests.cpp
# Opt level: O0

void __thiscall character_size_is_given::test_method(character_size_is_given *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_380;
  allocator local_379;
  string local_378;
  interface local_358;
  character_size local_308;
  uint local_304;
  basic_cstring<const_char> local_300;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2f0;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  undefined4 local_2a8;
  allocator local_2a1;
  string local_2a0;
  interface local_280;
  character_size local_230;
  uint local_22c;
  basic_cstring<const_char> local_228;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_218;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  undefined4 local_1d0;
  allocator local_1c9;
  string local_1c8;
  interface local_1a8;
  character_size local_158;
  uint local_154;
  basic_cstring<const_char> local_150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_140;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  undefined4 local_f8;
  allocator local_f1;
  string local_f0;
  interface local_d0;
  character_size local_7c;
  uint local_78 [4];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  character_size_is_given *local_10;
  character_size_is_given *this_local;
  
  local_10 = this;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_20,0x2c,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x30cf20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"com42:19200,7n1",&local_f1);
    interface::interface(&local_d0,&local_f0);
    local_7c = interface::character_size(&local_d0);
    local_78[0] = boost::asio::serial_port_base::character_size::value(&local_7c);
    local_f8 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_58,&local_68,0x2c,1,2,local_78,
               "interface(\"com42:19200,7n1\").character_size().value()",&local_f8,"7");
    interface::~interface(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_108,0x2d,&local_118);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_140,plVar3,(char (*) [1])0x30cf20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"com42:9200,8n1",&local_1c9);
    interface::interface(&local_1a8,&local_1c8);
    local_158 = interface::character_size(&local_1a8);
    local_154 = boost::asio::serial_port_base::character_size::value(&local_158);
    local_1d0 = 8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_140,&local_150,0x2d,1,2,&local_154,
               "interface(\"com42:9200,8n1\").character_size().value()",&local_1d0,"8");
    interface::~interface(&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_140);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1e0,0x2e,&local_1f0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_218,plVar3,(char (*) [1])0x30cf20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"com42:7n1",&local_2a1);
    interface::interface(&local_280,&local_2a0);
    local_230 = interface::character_size(&local_280);
    local_22c = boost::asio::serial_port_base::character_size::value(&local_230);
    local_2a8 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_218,&local_228,0x2e,1,2,&local_22c,
               "interface(\"com42:7n1\").character_size().value()",&local_2a8,"7");
    interface::~interface(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_218);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2b8,0x2f,&local_2c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2f0,plVar3,(char (*) [1])0x30cf20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]multi_serial_dump/interface_tests.cpp"
               ,0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"com42:8n1",&local_379);
    interface::interface(&local_358,&local_378);
    local_308 = interface::character_size(&local_358);
    local_304 = boost::asio::serial_port_base::character_size::value(&local_308);
    local_380 = 8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_2f0,&local_300,0x2f,1,2,&local_304,
               "interface(\"com42:8n1\").character_size().value()",&local_380,"8",local_304);
    interface::~interface(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( character_size_is_given )
{
    BOOST_CHECK_EQUAL( interface("com42:19200,7n1").character_size().value(), 7 );
    BOOST_CHECK_EQUAL( interface("com42:9200,8n1").character_size().value(), 8 );
    BOOST_CHECK_EQUAL( interface("com42:7n1").character_size().value(), 7 );
    BOOST_CHECK_EQUAL( interface("com42:8n1").character_size().value(), 8 );
}